

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O0

void __thiscall TiXmlAttributeSet::Remove(TiXmlAttributeSet *this,TiXmlAttribute *removeMe)

{
  TiXmlAttribute *local_20;
  TiXmlAttribute *node;
  TiXmlAttribute *removeMe_local;
  TiXmlAttributeSet *this_local;
  
  local_20 = (this->sentinel).next;
  while( true ) {
    if (local_20 == &this->sentinel) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/LiangLin0316[P]HZRobot/Include/xml/Source/tinyxml.cpp"
                    ,0x608,"void TiXmlAttributeSet::Remove(TiXmlAttribute *)");
    }
    if (local_20 == removeMe) break;
    local_20 = local_20->next;
  }
  local_20->prev->next = local_20->next;
  local_20->next->prev = local_20->prev;
  local_20->next = (TiXmlAttribute *)0x0;
  local_20->prev = (TiXmlAttribute *)0x0;
  return;
}

Assistant:

void TiXmlAttributeSet::Remove( TiXmlAttribute* removeMe )
{
	TiXmlAttribute* node;

	for( node = sentinel.next; node != &sentinel; node = node->next )
	{
		if ( node == removeMe )
		{
			node->prev->next = node->next;
			node->next->prev = node->prev;
			node->next = 0;
			node->prev = 0;
			return;
		}
	}
	assert( 0 );		// we tried to remove a non-linked attribute.
}